

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_post_edge_split(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE ref_node;
  REF_ADJ pRVar1;
  uint uVar2;
  REF_BOOL allowed;
  int local_2c;
  
  ref_node = ref_grid->node;
  ref_smooth_local_cell_about(ref_grid->cell[8],ref_node,node,&local_2c);
  if (local_2c == 0) {
    ref_node->age[node] = ref_node->age[node] + 1;
  }
  else if ((node < 0) ||
          (((pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= node ||
            (pRVar1->first[(uint)node] == -1)) &&
           ((pRVar1 = ref_grid->cell[6]->ref_adj, pRVar1->nnode <= node ||
            (pRVar1->first[(uint)node] == -1)))))) {
    uVar2 = ref_smooth_tet_improve(ref_grid,node);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x7d3,"ref_smooth_post_edge_split",(ulong)uVar2,"ideal tet node");
      return uVar2;
    }
    ref_node->age[node] = 0;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_post_edge_split(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_BOOL allowed, interior;

  RSS(ref_smooth_local_cell_about(ref_grid_tet(ref_grid), ref_node, node,
                                  &allowed),
      "para");
  if (!allowed) {
    ref_node_age(ref_node, node)++;
    return REF_SUCCESS;
  }

  interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
             ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  if (interior) {
    RSS(ref_smooth_tet_improve(ref_grid, node), "ideal tet node");
    ref_node_age(ref_node, node) = 0;
  }

  return REF_SUCCESS;
}